

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyTypeObject * pybind11::detail::make_default_metaclass(void)

{
  int iVar1;
  PyTypeObject *pPVar2;
  handle *phVar3;
  error_already_set *this;
  object name_obj;
  handle local_28;
  handle local_20;
  
  local_28.m_ptr = (PyObject *)PyUnicode_FromString("pybind11_type");
  pPVar2 = (PyTypeObject *)(*__filebuf)(&PyType_Type,0);
  if (pPVar2 == (PyTypeObject *)0x0) {
    pybind11_fail("make_default_metaclass(): error allocating metaclass!");
  }
  phVar3 = handle::inc_ref(&local_28);
  pPVar2[2].tp_basicsize = (Py_ssize_t)phVar3->m_ptr;
  phVar3 = handle::inc_ref(&local_28);
  pPVar2[2].tp_dealloc = (destructor)phVar3->m_ptr;
  pPVar2->tp_name = "pybind11_type";
  _PyType_Type = _PyType_Type + 1;
  pPVar2->tp_base = (_typeobject *)&PyType_Type;
  pPVar2->tp_flags = 0x600;
  pPVar2->tp_call = pybind11_meta_call;
  pPVar2->tp_setattro = pybind11_meta_setattro;
  pPVar2->tp_getattro = pybind11_meta_getattro;
  pPVar2->tp_dealloc = pybind11_meta_dealloc;
  iVar1 = PyType_Ready(pPVar2);
  if (-1 < iVar1) {
    str::str((str *)&local_20,"pybind11_builtins");
    iVar1 = PyObject_SetAttrString(pPVar2,"__module__",local_20.m_ptr);
    if (iVar1 == 0) {
      handle::dec_ref(&local_20);
      handle::dec_ref(&local_28);
      return pPVar2;
    }
    this = (error_already_set *)__cxa_allocate_exception(0x18);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");
}

Assistant:

inline PyTypeObject *make_default_metaclass() {
    constexpr auto *name = "pybind11_type";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type) {
        pybind11_fail("make_default_metaclass(): error allocating metaclass!");
    }

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyType_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_call = pybind11_meta_call;

    type->tp_setattro = pybind11_meta_setattro;
    type->tp_getattro = pybind11_meta_getattro;

    type->tp_dealloc = pybind11_meta_dealloc;

    if (PyType_Ready(type) < 0) {
        pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");
    }

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}